

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O3

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  int iVar11;
  int *piVar12;
  void *pvVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  size_t sVar17;
  long lVar18;
  
  iVar9 = bottom_blob->dims;
  iVar15 = bottom_blob->w;
  iVar16 = bottom_blob->h;
  iVar14 = bottom_blob->c;
  iVar8 = iVar15;
  iVar11 = iVar16;
  iVar5 = iVar9;
  iVar6 = iVar14;
  if (top_blob != bottom_blob) {
    piVar12 = bottom_blob->refcount;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + 1;
      UNLOCK();
    }
    piVar12 = top_blob->refcount;
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if ((*piVar12 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    top_blob->elemsize = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    piVar12 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar12;
    top_blob->elemsize = bottom_blob->elemsize;
    iVar5 = bottom_blob->dims;
    top_blob->dims = iVar5;
    iVar8 = bottom_blob->w;
    top_blob->w = iVar8;
    iVar11 = bottom_blob->h;
    top_blob->h = iVar11;
    iVar6 = bottom_blob->c;
    top_blob->c = iVar6;
    top_blob->cstep = bottom_blob->cstep;
  }
  iVar1 = this->squeeze_h;
  if ((iVar14 == 1 && iVar9 == 3) && this->squeeze_c != 0) {
    iVar9 = bottom_blob->w;
    iVar14 = bottom_blob->h;
    iVar5 = bottom_blob->c;
    iVar8 = iVar14 * iVar9 * iVar5;
    if (iVar16 == 1 && iVar1 != 0) {
      sVar17 = 0;
      bVar4 = true;
      if (iVar8 == iVar15) {
        sVar17 = (size_t)iVar15;
        if ((bottom_blob->dims == 3) && (bottom_blob->cstep != (long)iVar14 * (long)iVar9)) {
          sVar10 = bottom_blob->elemsize;
          if (iVar15 == 0) {
            pvVar13 = (void *)0x0;
            piVar12 = (int *)0x0;
          }
          else {
            lVar18 = sVar10 * sVar17;
            pvVar7 = malloc(lVar18 + 0x1c);
            pvVar13 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar13 + -8) = pvVar7;
            piVar12 = (int *)((long)pvVar13 + lVar18);
            *(undefined4 *)((long)pvVar13 + lVar18) = 1;
            iVar5 = bottom_blob->c;
          }
          if (0 < iVar5) {
            lVar18 = 0;
            do {
              sVar2 = bottom_blob->elemsize;
              iVar9 = bottom_blob->h * bottom_blob->w;
              memcpy((void *)((long)((int)lVar18 * iVar9) * sVar2 + (long)pvVar13),
                     (void *)(bottom_blob->cstep * lVar18 * sVar2 + (long)bottom_blob->data),
                     (long)iVar9 * sVar2);
              lVar18 = lVar18 + 1;
            } while (lVar18 < bottom_blob->c);
          }
        }
        else {
          pvVar13 = bottom_blob->data;
          piVar12 = bottom_blob->refcount;
          sVar10 = bottom_blob->elemsize;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
        }
        bVar4 = true;
        iVar9 = 1;
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
          bVar4 = false;
        }
      }
      else {
        iVar15 = 0;
        iVar9 = 0;
        sVar10 = 0;
        piVar12 = (int *)0x0;
        pvVar13 = (void *)0x0;
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if ((*piVar3 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->data = pvVar13;
      top_blob->refcount = piVar12;
      top_blob->elemsize = sVar10;
      top_blob->dims = iVar9;
      top_blob->w = iVar15;
      top_blob->h = iVar9;
      top_blob->c = iVar9;
      top_blob->cstep = sVar17;
      if (bVar4) goto LAB_0012817e;
      LOCK();
      *piVar12 = *piVar12 + -1;
      iVar9 = *piVar12;
      UNLOCK();
    }
    else {
      sVar17 = 0;
      bVar4 = true;
      if (iVar8 == iVar16 * iVar15) {
        if ((bottom_blob->dims == 3) && (bottom_blob->cstep != (long)iVar14 * (long)iVar9)) {
          sVar10 = bottom_blob->elemsize;
          if (iVar8 == 0) {
            pvVar13 = (void *)0x0;
            piVar12 = (int *)0x0;
          }
          else {
            lVar18 = sVar10 * (long)iVar8;
            pvVar7 = malloc(lVar18 + 0x1c);
            pvVar13 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar13 + -8) = pvVar7;
            piVar12 = (int *)((long)pvVar13 + lVar18);
            *(undefined4 *)((long)pvVar13 + lVar18) = 1;
            iVar5 = bottom_blob->c;
          }
          if (0 < iVar5) {
            lVar18 = 0;
            do {
              sVar17 = bottom_blob->elemsize;
              iVar9 = bottom_blob->h * bottom_blob->w;
              memcpy((void *)((long)((int)lVar18 * iVar9) * sVar17 + (long)pvVar13),
                     (void *)(bottom_blob->cstep * lVar18 * sVar17 + (long)bottom_blob->data),
                     (long)iVar9 * sVar17);
              lVar18 = lVar18 + 1;
            } while (lVar18 < bottom_blob->c);
          }
        }
        else {
          pvVar13 = bottom_blob->data;
          piVar12 = bottom_blob->refcount;
          sVar10 = bottom_blob->elemsize;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
        }
        bVar4 = true;
        sVar17 = (size_t)iVar8;
        iVar14 = 2;
        iVar9 = 1;
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
          bVar4 = false;
        }
      }
      else {
        iVar9 = 0;
        iVar16 = 0;
        iVar15 = 0;
        iVar14 = 0;
        sVar10 = 0;
        piVar12 = (int *)0x0;
        pvVar13 = (void *)0x0;
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if ((*piVar3 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->data = pvVar13;
      top_blob->refcount = piVar12;
      top_blob->elemsize = sVar10;
      top_blob->dims = iVar14;
      top_blob->w = iVar15;
      top_blob->h = iVar16;
      top_blob->c = iVar9;
      top_blob->cstep = sVar17;
      if (bVar4) goto LAB_0012817e;
      LOCK();
      *piVar12 = *piVar12 + -1;
      iVar9 = *piVar12;
      UNLOCK();
    }
  }
  else {
    sVar17 = (size_t)iVar14;
    if (iVar16 == 1 && (1 < iVar9 && iVar1 != 0)) {
      iVar9 = bottom_blob->w;
      iVar16 = bottom_blob->h;
      iVar5 = bottom_blob->c;
      iVar8 = iVar16 * iVar9 * iVar5;
      if (iVar15 != 1 || this->squeeze_w == 0) {
        sVar17 = 0;
        bVar4 = true;
        if (iVar8 == iVar14 * iVar15) {
          if ((bottom_blob->dims == 3) && (bottom_blob->cstep != (long)iVar16 * (long)iVar9)) {
            sVar10 = bottom_blob->elemsize;
            if (iVar8 == 0) {
              pvVar13 = (void *)0x0;
              piVar12 = (int *)0x0;
            }
            else {
              lVar18 = sVar10 * (long)iVar8;
              pvVar7 = malloc(lVar18 + 0x1c);
              pvVar13 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
              *(void **)((long)pvVar13 + -8) = pvVar7;
              piVar12 = (int *)((long)pvVar13 + lVar18);
              *(undefined4 *)((long)pvVar13 + lVar18) = 1;
              iVar5 = bottom_blob->c;
            }
            if (0 < iVar5) {
              lVar18 = 0;
              do {
                sVar17 = bottom_blob->elemsize;
                iVar9 = bottom_blob->h * bottom_blob->w;
                memcpy((void *)((long)((int)lVar18 * iVar9) * sVar17 + (long)pvVar13),
                       (void *)(bottom_blob->cstep * lVar18 * sVar17 + (long)bottom_blob->data),
                       (long)iVar9 * sVar17);
                lVar18 = lVar18 + 1;
              } while (lVar18 < bottom_blob->c);
            }
          }
          else {
            pvVar13 = bottom_blob->data;
            piVar12 = bottom_blob->refcount;
            sVar10 = bottom_blob->elemsize;
            if (piVar12 != (int *)0x0) {
              LOCK();
              *piVar12 = *piVar12 + 1;
              UNLOCK();
            }
          }
          sVar17 = (size_t)iVar8;
          bVar4 = true;
          iVar16 = 2;
          iVar9 = 1;
          if (piVar12 == (int *)0x0) {
            piVar12 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
            bVar4 = false;
          }
        }
        else {
          iVar9 = 0;
          iVar14 = 0;
          iVar15 = 0;
          iVar16 = 0;
          sVar10 = 0;
          piVar12 = (int *)0x0;
          pvVar13 = (void *)0x0;
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if ((*piVar3 == 0) && (top_blob->data != (void *)0x0)) {
            free(*(void **)((long)top_blob->data + -8));
          }
        }
        top_blob->data = pvVar13;
        top_blob->refcount = piVar12;
        top_blob->elemsize = sVar10;
        top_blob->dims = iVar16;
        top_blob->w = iVar15;
        top_blob->h = iVar14;
        top_blob->c = iVar9;
        top_blob->cstep = sVar17;
        if (bVar4) goto LAB_0012817e;
        LOCK();
        *piVar12 = *piVar12 + -1;
        iVar9 = *piVar12;
        UNLOCK();
        goto joined_r0x00128087;
      }
      if (iVar8 == iVar14) {
        if ((bottom_blob->dims == 3) && (bottom_blob->cstep != (long)iVar16 * (long)iVar9)) {
          sVar10 = bottom_blob->elemsize;
          if (iVar14 == 0) {
            pvVar13 = (void *)0x0;
            piVar12 = (int *)0x0;
          }
          else {
            lVar18 = sVar10 * sVar17;
            pvVar7 = malloc(lVar18 + 0x1c);
            pvVar13 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar13 + -8) = pvVar7;
            piVar12 = (int *)((long)pvVar13 + lVar18);
            *(undefined4 *)((long)pvVar13 + lVar18) = 1;
            iVar5 = bottom_blob->c;
          }
          if (0 < iVar5) {
            lVar18 = 0;
            do {
              sVar2 = bottom_blob->elemsize;
              iVar9 = bottom_blob->h * bottom_blob->w;
              memcpy((void *)((long)((int)lVar18 * iVar9) * sVar2 + (long)pvVar13),
                     (void *)(bottom_blob->cstep * lVar18 * sVar2 + (long)bottom_blob->data),
                     (long)iVar9 * sVar2);
              lVar18 = lVar18 + 1;
            } while (lVar18 < bottom_blob->c);
          }
        }
        else {
LAB_00127c19:
          pvVar13 = bottom_blob->data;
          piVar12 = bottom_blob->refcount;
          sVar10 = bottom_blob->elemsize;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
        }
LAB_00127c33:
        bVar4 = true;
        iVar9 = 1;
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
          bVar4 = false;
        }
      }
      else {
LAB_00127cdb:
        iVar9 = 0;
        bVar4 = true;
        sVar17 = 0;
        iVar14 = 0;
        sVar10 = 0;
        piVar12 = (int *)0x0;
        pvVar13 = (void *)0x0;
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if ((*piVar3 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->data = pvVar13;
      top_blob->refcount = piVar12;
      top_blob->elemsize = sVar10;
      top_blob->dims = iVar9;
      top_blob->w = iVar14;
      top_blob->h = iVar9;
      top_blob->c = iVar9;
      top_blob->cstep = sVar17;
      if (bVar4) goto LAB_0012817e;
    }
    else {
      if (iVar15 != 1 || (iVar9 < 1 || this->squeeze_w == 0)) goto LAB_0012817e;
      if (iVar1 != 0 && iVar16 == 1) {
        iVar9 = bottom_blob->c;
        if (bottom_blob->h * bottom_blob->w * iVar9 != iVar14) goto LAB_00127cdb;
        if ((bottom_blob->dims != 3) ||
           (bottom_blob->cstep == (long)bottom_blob->h * (long)bottom_blob->w)) goto LAB_00127c19;
        sVar10 = bottom_blob->elemsize;
        if (iVar14 == 0) {
          pvVar13 = (void *)0x0;
          piVar12 = (int *)0x0;
        }
        else {
          lVar18 = sVar10 * sVar17;
          pvVar7 = malloc(lVar18 + 0x1c);
          pvVar13 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar13 + -8) = pvVar7;
          piVar12 = (int *)((long)pvVar13 + lVar18);
          *(undefined4 *)((long)pvVar13 + lVar18) = 1;
          iVar9 = bottom_blob->c;
        }
        if (0 < iVar9) {
          lVar18 = 0;
          do {
            sVar2 = bottom_blob->elemsize;
            iVar9 = bottom_blob->h * bottom_blob->w;
            memcpy((void *)((long)((int)lVar18 * iVar9) * sVar2 + (long)pvVar13),
                   (void *)(bottom_blob->cstep * lVar18 * sVar2 + (long)bottom_blob->data),
                   (long)iVar9 * sVar2);
            lVar18 = lVar18 + 1;
          } while (lVar18 < bottom_blob->c);
        }
        goto LAB_00127c33;
      }
      iVar9 = iVar11 * iVar8 * iVar6;
      sVar17 = 0;
      bVar4 = true;
      if (iVar9 == iVar14 * iVar16) {
        if ((iVar5 == 3) && (bottom_blob->cstep != (long)iVar11 * (long)iVar8)) {
          sVar10 = bottom_blob->elemsize;
          if (iVar9 == 0) {
            pvVar13 = (void *)0x0;
            piVar12 = (int *)0x0;
          }
          else {
            lVar18 = sVar10 * (long)iVar9;
            pvVar7 = malloc(lVar18 + 0x1c);
            pvVar13 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
            *(void **)((long)pvVar13 + -8) = pvVar7;
            piVar12 = (int *)((long)pvVar13 + lVar18);
            *(undefined4 *)((long)pvVar13 + lVar18) = 1;
            iVar6 = bottom_blob->c;
          }
          if (0 < iVar6) {
            lVar18 = 0;
            do {
              sVar17 = bottom_blob->elemsize;
              iVar15 = bottom_blob->h * bottom_blob->w;
              memcpy((void *)((long)((int)lVar18 * iVar15) * sVar17 + (long)pvVar13),
                     (void *)(bottom_blob->cstep * lVar18 * sVar17 + (long)bottom_blob->data),
                     (long)iVar15 * sVar17);
              lVar18 = lVar18 + 1;
            } while (lVar18 < bottom_blob->c);
          }
        }
        else {
          pvVar13 = bottom_blob->data;
          piVar12 = bottom_blob->refcount;
          sVar10 = bottom_blob->elemsize;
          if (piVar12 != (int *)0x0) {
            LOCK();
            *piVar12 = *piVar12 + 1;
            UNLOCK();
          }
        }
        bVar4 = true;
        sVar17 = (size_t)iVar9;
        iVar15 = 2;
        iVar9 = 1;
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar12 = *piVar12 + 1;
          UNLOCK();
          bVar4 = false;
        }
      }
      else {
        iVar9 = 0;
        iVar14 = 0;
        iVar16 = 0;
        iVar15 = 0;
        sVar10 = 0;
        piVar12 = (int *)0x0;
        pvVar13 = (void *)0x0;
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if ((*piVar3 == 0) && (top_blob->data != (void *)0x0)) {
          free(*(void **)((long)top_blob->data + -8));
        }
      }
      top_blob->data = pvVar13;
      top_blob->refcount = piVar12;
      top_blob->elemsize = sVar10;
      top_blob->dims = iVar15;
      top_blob->w = iVar16;
      top_blob->h = iVar14;
      top_blob->c = iVar9;
      top_blob->cstep = sVar17;
      if (bVar4) goto LAB_0012817e;
    }
    LOCK();
    *piVar12 = *piVar12 + -1;
    iVar9 = *piVar12;
    UNLOCK();
  }
joined_r0x00128087:
  if ((iVar9 == 0) && (pvVar13 != (void *)0x0)) {
    free(*(void **)((long)pvVar13 + -8));
  }
LAB_0012817e:
  if ((top_blob->data == (void *)0x0) || (iVar9 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar9 = -100;
  }
  return iVar9;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    top_blob = bottom_blob;

    if (squeeze_c && dims == 3 && channels == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(w);
        else
            top_blob = bottom_blob.reshape(w, h);
    }
    else if (squeeze_h && dims >= 2 && h == 1)
    {
        if (squeeze_w && w == 1)
            top_blob = bottom_blob.reshape(channels);
        else
            top_blob = bottom_blob.reshape(w, channels);
    }
    else if (squeeze_w && dims >= 1 && w == 1)
    {
        if (squeeze_h && h == 1)
            top_blob = bottom_blob.reshape(channels);
        else
            top_blob = bottom_blob.reshape(h, channels);
    }

    if (top_blob.empty())
        return -100;

    return 0;
}